

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_RepeatedSetFieldTest_Test::TestBody
          (ComparisonTest_RepeatedSetFieldTest_Test *this)

{
  bool bVar1;
  TestAllTypes_RepeatedGroup *pTVar2;
  char *message;
  TestAllTypes *this_00;
  TestAllTypes *this_01;
  AssertHelper local_88;
  Message local_80;
  string local_78;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  allocator<char> local_31;
  string local_30;
  ComparisonTest_RepeatedSetFieldTest_Test *local_10;
  ComparisonTest_RepeatedSetFieldTest_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"repeatedgroup",&local_31);
  ComparisonTest::field_as_set(&this->super_ComparisonTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this_00 = &(this->super_ComparisonTest).proto1_;
  proto2_unittest::TestAllTypes::clear_repeatedgroup(this_00);
  this_01 = &(this->super_ComparisonTest).proto2_;
  proto2_unittest::TestAllTypes::clear_repeatedgroup(this_01);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeatedgroup(this_01);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(pTVar2,0x38d);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeatedgroup(this_01);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(pTVar2,0x38b);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeatedgroup(this_00);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(pTVar2,0x13d);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeatedgroup(this_00);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(pTVar2,0x388);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeatedgroup(this_00);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(pTVar2,0x38b);
  pTVar2 = proto2_unittest::TestAllTypes::add_repeatedgroup(this_00);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(pTVar2,0x38d);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_(&local_78,this);
  testing::internal::EqHelper::
  Compare<char[191],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_58,
             "\"moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\\n\" \"moved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\\n\" \"deleted: repeatedgroup[0]: { a: 317 }\\n\" \"deleted: repeatedgroup[1]: { a: 904 }\\n\""
             ,"Run()",(char (*) [191])
                      "moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\nmoved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\ndeleted: repeatedgroup[0]: { a: 317 }\ndeleted: repeatedgroup[1]: { a: 904 }\n"
             ,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd3b,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  return;
}

Assistant:

TEST_F(ComparisonTest, RepeatedSetFieldTest) {
  field_as_set("repeatedgroup");

  proto1_.clear_repeatedgroup();
  proto2_.clear_repeatedgroup();
  proto2_.add_repeatedgroup()->set_a(909);
  proto2_.add_repeatedgroup()->set_a(907);
  proto1_.add_repeatedgroup()->set_a(317);
  proto1_.add_repeatedgroup()->set_a(904);
  proto1_.add_repeatedgroup()->set_a(907);
  proto1_.add_repeatedgroup()->set_a(909);

  EXPECT_EQ(
      "moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\n"
      "moved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\n"
      "deleted: repeatedgroup[0]: { a: 317 }\n"
      "deleted: repeatedgroup[1]: { a: 904 }\n",
      Run());
}